

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

bool __thiscall CppJieba::Trie::_deleteNode(Trie *this,TrieNode *node)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false> node_00;
  Trie *in_RSI;
  TrieNode *next;
  iterator it;
  unordered_map<unsigned_short,_CppJieba::TrieNode_*,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>_>
  *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false> local_20;
  
  node_00._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_short,_CppJieba::TrieNode_*,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_short,_CppJieba::TrieNode_*,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false>
                        *)&stack0xffffffffffffffe8,&local_20);
    if (!bVar1) break;
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false,_false>::operator->
              ((_Node_iterator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false,_false>
                *)0x137d65);
    _deleteNode(in_RSI,(TrieNode *)node_00._M_cur);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_false,_false>
                *)in_stack_ffffffffffffffb8,0);
  }
  if (in_RSI != (Trie *)0x0) {
    TrieNode::~TrieNode((TrieNode *)0x137daa);
    operator_delete(in_RSI);
  }
  return true;
}

Assistant:

bool _deleteNode(TrieNode* node)
            {
                for(TrieNodeMap::iterator it = node->hmap.begin(); it != node->hmap.end(); it++)
                {
                    TrieNode* next = it->second;
                    _deleteNode(next);
                }

                delete node;
                return true;
            }